

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::IsFoldableVectorType
          (InstructionFolder *this,Instruction *type_inst)

{
  Op OVar1;
  uint32_t id;
  DefUseManager *this_00;
  Instruction *type_inst_00;
  bool local_39;
  Instruction *def_component_type;
  uint32_t component_type_id;
  Instruction *type_inst_local;
  InstructionFolder *this_local;
  
  OVar1 = opt::Instruction::opcode(type_inst);
  if (OVar1 == OpTypeVector) {
    id = opt::Instruction::GetSingleWordInOperand(type_inst,0);
    this_00 = IRContext::get_def_use_mgr(this->context_);
    type_inst_00 = analysis::DefUseManager::GetDef(this_00,id);
    local_39 = false;
    if (type_inst_00 != (Instruction *)0x0) {
      local_39 = IsFoldableScalarType(this,type_inst_00);
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InstructionFolder::IsFoldableVectorType(Instruction* type_inst) const {
  // Support vectors with foldable components
  if (type_inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_type_id = type_inst->GetSingleWordInOperand(0);
    Instruction* def_component_type =
        context_->get_def_use_mgr()->GetDef(component_type_id);
    return def_component_type != nullptr &&
           IsFoldableScalarType(def_component_type);
  }
  // Nothing else yet.
  return false;
}